

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_gbk_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  zueci_u32 *in_RCX;
  uint in_ESI;
  byte *in_RDI;
  int m;
  int e;
  int s;
  zueci_u16 mb;
  zueci_u32 u2;
  int ind;
  uchar c2;
  uchar c1;
  int local_38;
  int local_34;
  int local_28;
  undefined2 local_22;
  int local_4;
  
  bVar1 = *in_RDI;
  if (bVar1 < 0x80) {
    *in_RCX = (uint)bVar1;
    local_4 = 1;
  }
  else if (((in_ESI < 2) || (bVar1 < 0x81)) || (bVar1 == 0xff)) {
    local_4 = 0;
  }
  else {
    bVar2 = in_RDI[1];
    local_22 = CONCAT11(bVar1,bVar2);
    if (((bVar2 < 0x40) || (bVar2 == 0x7f)) || (bVar2 == 0xff)) {
      local_4 = 0;
    }
    else {
      if ((((0xa0 < bVar1) && (bVar1 < 0xaa)) || ((0xaf < bVar1 && (bVar1 < 0xf8)))) &&
         (0xa0 < bVar2)) {
        if ((bVar1 == 0xa1) && (bVar2 == 0xa4)) {
          *in_RCX = 0xb7;
          return 2;
        }
        if ((bVar1 == 0xa1) && (bVar2 == 0xaa)) {
          *in_RCX = 0x2014;
          return 2;
        }
        iVar3 = zueci_gb2312_u(in_RDI,in_ESI,0,in_RCX);
        if (iVar3 != 0) {
          return 2;
        }
      }
      if ((0xa1a3 < local_22) && (local_22 < 0xfe50)) {
        local_34 = 0;
        local_38 = 0xd0;
        while (local_34 <= local_38) {
          iVar3 = local_34 + local_38 >> 1;
          if (zueci_gbk_nonuro_mb[iVar3] < local_22) {
            local_34 = iVar3 + 1;
          }
          else {
            if (zueci_gbk_nonuro_mb[iVar3] <= local_22) {
              *in_RCX = (uint)zueci_gbk_nonuro_u[iVar3];
              return 2;
            }
            local_38 = iVar3 + -1;
          }
        }
      }
      if ((bVar1 < 0xa1) || ((0xa7 < bVar1 && ((bVar1 < 0xa8 || (bVar2 < 0xa1)))))) {
        if (bVar1 < 0xa8) {
          local_28 = ((bVar1 - 0x81) * 0xbe + (uint)bVar2 + -0x40) - (uint)(0x7f < bVar2);
        }
        else {
          local_28 = ((bVar1 - 0xa8) * 0x60 + (uint)bVar2 + 0x1780) - (uint)(0x7f < bVar2);
        }
        if ((local_28 < 0x3810) && (zueci_gbk_mb_u[local_28] != 0)) {
          *in_RCX = (uint)zueci_gbk_mb_u[local_28];
          local_4 = 2;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int zueci_gbk_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2;
    int ind;
    zueci_u32 u2;
    zueci_u16 mb;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0x81 || c1 == 0xFF) {
        return 0;
    }
    c2 = src[1];
    if (c2 < 0x40 || c2 == 0x7F || c2 == 0xFF) {
        return 0;
    }

    /* Try GB 2312 first */
    if (((c1 >= 0xA1 && c1 <= 0xA9) || (c1 >= 0xB0 && c1 <= 0xF7)) && c2 >= 0xA1) {
        if (c1 == 0xA1 && c2 == 0xA4) {
            *p_u = 0x00B7; /* MIDDLE DOT */
            return 2;
        }
        if (c1 == 0xA1 && c2 == 0xAA) {
            *p_u = 0x2014; /* EM DASH */
            return 2;
        }
        if (zueci_gb2312_u(src, len, 0 /*flags*/, p_u)) {
            return 2;
        }
    }

    /* Non-URO? */
    mb = ((zueci_u16) c1 << 8) | c2;
    if (mb >= zueci_gbk_nonuro_mb[0] && mb <= zueci_gbk_nonuro_mb[ZUECI_ASIZE(zueci_gbk_nonuro_mb) - 1]) {
        int s = 0;
        int e = ZUECI_ASIZE(zueci_gbk_nonuro_mb) - 1;
        while (s <= e) {
            const int m = (s + e) >> 1;
            if (zueci_gbk_nonuro_mb[m] < mb) {
                s = m + 1;
            } else if (zueci_gbk_nonuro_mb[m] > mb) {
                e = m - 1;
            } else {
                *p_u = zueci_gbk_nonuro_u[m];
                return 2;
            }
        }
    }

    if (c1 >= 0xA1 && (c1 <= 0xA7 || (c1 >= 0xA8 && c2 >= 0xA1))) {
        return 0;
    }
    if (c1 >= 0xA8) {
        ind = (0xFF - 0x40 - 1) * (0xA1 - 0x81) + (0xA1 - 0x40 - 1) * (c1 - 0xA8) + c2 - 0x40 - (c2 > 0x7F);
    } else {
        ind = (0xFF - 0x40 - 1) * (c1 - 0x81) + c2 - 0x40 - (c2 > 0x7F);
    }
    if (ind < ZUECI_ASIZE(zueci_gbk_mb_u) && (u2 = zueci_gbk_mb_u[ind])) {
        *p_u = u2;
        return 2;
    }
    return 0;
}